

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O0

int ndn_hmac_verify(uint8_t *input_value,uint32_t input_size,uint8_t *sig_value,uint32_t sig_size,
                   ndn_hmac_key_t *hmac_key)

{
  int iVar1;
  uint8_t local_58 [8];
  uint8_t input_hmac [32];
  ndn_hmac_key_t *hmac_key_local;
  uint32_t sig_size_local;
  uint8_t *sig_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  if (sig_size == 0x20) {
    input_hmac._24_8_ = hmac_key;
    memset(local_58,0,0x20);
    ndn_hmac_sha256(input_value,input_size,(ndn_hmac_key_t *)input_hmac._24_8_,local_58);
    iVar1 = ndn_const_time_memcmp(local_58,sig_value,0x20);
    if (iVar1 == 0) {
      input_value_local._4_4_ = 0;
    }
    else {
      input_value_local._4_4_ = -0x1d;
    }
  }
  else {
    input_value_local._4_4_ = -0x17;
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_hmac_verify(const uint8_t* input_value, uint32_t input_size,
                const uint8_t* sig_value, uint32_t sig_size,
                const ndn_hmac_key_t* hmac_key)
{
  if (sig_size != NDN_SEC_SHA256_HASH_SIZE)
    return NDN_SEC_WRONG_SIG_SIZE;

  uint8_t input_hmac[NDN_SEC_SHA256_HASH_SIZE] = {0};
  ndn_hmac_sha256(input_value, input_size, hmac_key, input_hmac);
  if (ndn_const_time_memcmp(input_hmac, sig_value, sizeof(input_hmac)) != NDN_SUCCESS)
    return NDN_SEC_FAIL_VERIFY_SIG;
  else
    return NDN_SUCCESS;
}